

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

void __thiscall
helics::Filter::setOperator(Filter *this,shared_ptr<helics::FilterOperator> *filterOp)

{
  uint uVar1;
  Core *pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  pCVar2 = (this->super_Interface).mCore;
  uVar1 = (this->super_Interface).handle.hid;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (filterOp->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (*pCVar2->_vptr_Core[0x54])(pCVar2,(ulong)uVar1);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void Filter::setOperator(std::shared_ptr<FilterOperator> filterOp)
{
    mCore->setFilterOperator(handle, std::move(filterOp));
}